

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

void __thiscall
EthUdpPort::EthUdpPort
          (EthUdpPort *this,int portNum,string *serverIP,bool forceFwBridge,ostream *debugStream,
          EthCallbackType cb)

{
  pointer pcVar1;
  ostream *poVar2;
  int iVar3;
  SocketInternals *this_00;
  char *pcVar4;
  
  EthBasePort::EthBasePort(&this->super_EthBasePort,portNum,forceFwBridge,debugStream,cb);
  (this->super_EthBasePort).super_BasePort._vptr_BasePort = (_func_int **)&PTR_Init_00126970;
  (this->ServerIP)._M_dataplus._M_p = (pointer)&(this->ServerIP).field_2;
  pcVar1 = (serverIP->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ServerIP,pcVar1,pcVar1 + serverIP->_M_string_length);
  (this->MulticastIP)._M_dataplus._M_p = (pointer)&(this->MulticastIP).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->MulticastIP,"224.0.0.100","");
  this->UDP_port = 0x572;
  this_00 = (SocketInternals *)operator_new(0x68);
  SocketInternals::SocketInternals(this_00,debugStream);
  this->sockPtr = this_00;
  iVar3 = (**(this->super_EthBasePort).super_BasePort._vptr_BasePort)(this);
  pcVar4 = "Initialization failed";
  if ((byte)iVar3 != 0) {
    pcVar4 = "Initialization done";
  }
  poVar2 = (this->super_EthBasePort).super_BasePort.outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar4,(ulong)(byte)((byte)iVar3 ^ 1) * 2 + 0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

EthUdpPort::EthUdpPort(int portNum, const std::string &serverIP, bool forceFwBridge, std::ostream &debugStream, EthCallbackType cb):
    EthBasePort(portNum, forceFwBridge, debugStream, cb),
    ServerIP(serverIP),
    MulticastIP(ETH_UDP_MULTICAST_DEFAULT_IP),
    UDP_port(1394)
{
    sockPtr = new SocketInternals(debugStream);
    if (Init())
        outStr << "Initialization done" << std::endl;
    else
        outStr << "Initialization failed" << std::endl;
}